

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::VarScope::copyFrom(VarScope *this,VarScope *other)

{
  mapped_type pVVar1;
  mapped_type *ppVVar2;
  _Hash_node_base *p_Var3;
  
  do {
    p_Var3 = (other->symbols)._M_h._M_before_begin._M_nxt;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      do {
        pVVar1 = (mapped_type)p_Var3[2]._M_nxt;
        ppVVar2 = std::__detail::
                  _Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->symbols,(key_type *)(p_Var3 + 1));
        *ppVVar2 = pVVar1;
        p_Var3 = p_Var3->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    this = this->parent;
    other = other->parent;
  } while (this != (VarScope *)0x0);
  return;
}

Assistant:

void VarScope::copyFrom(const VarScope *other) {
  VarScope *l = this;
  const VarScope *r = other;

  while (l) {
    assert(l->owner == r->owner && "Scope corruption");

    auto &thisSymbols = l->symbols;
    auto &otherSymbols = r->symbols;
    auto it = otherSymbols.begin();
    auto ie = otherSymbols.end();

    while (it != ie) {
      thisSymbols[it->first] = it->second;
      ++it;
    }

    l = l->parent;
    r = r->parent;
  }
}